

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLin>
               *this,GetterXsYs<short> *getter1,GetterXsYRef<short> *getter2,
              TransformerLinLin *transformer,ImU32 col)

{
  TransformerLinLin *pTVar1;
  int iVar2;
  ImVec2 IVar3;
  ImPlotPoint local_60;
  ImPlotPoint local_48;
  ImVec2 local_34;
  ImU32 local_2c;
  TransformerLinLin *pTStack_28;
  ImU32 col_local;
  TransformerLinLin *transformer_local;
  GetterXsYRef<short> *getter2_local;
  GetterXsYs<short> *getter1_local;
  ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLin>
  *this_local;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  local_2c = col;
  pTStack_28 = transformer;
  transformer_local = (TransformerLinLin *)getter2;
  getter2_local = (GetterXsYRef<short> *)getter1;
  getter1_local = (GetterXsYs<short> *)this;
  iVar2 = ImMin<int>(this->Getter1->Count,this->Getter2->Count);
  this->Prims = iVar2 + -1;
  this->Col = local_2c;
  ImVec2::ImVec2(&this->P11);
  ImVec2::ImVec2(&this->P12);
  pTVar1 = this->Transformer;
  local_48 = GetterXsYs<short>::operator()(this->Getter1,0);
  local_34 = TransformerLinLin::operator()(pTVar1,&local_48);
  this->P11 = local_34;
  pTVar1 = this->Transformer;
  local_60 = GetterXsYRef<short>::operator()(this->Getter2,0);
  IVar3 = TransformerLinLin::operator()(pTVar1,&local_60);
  this->P12 = IVar3;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }